

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O3

int __thiscall ncnn::BatchNorm::load_model(BatchNorm *this,ModelBin *mb)

{
  Allocator *pAVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  void *ptr;
  void *local_68;
  int *local_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  size_t local_30;
  
  (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->channels,1);
  if (&this->slope_data != (Mat *)&local_68) {
    if (local_60 != (int *)0x0) {
      LOCK();
      *local_60 = *local_60 + 1;
      UNLOCK();
    }
    piVar7 = (this->slope_data).refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pvVar9 = (this->slope_data).data;
        pAVar1 = (this->slope_data).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          if (pvVar9 != (void *)0x0) {
            free(pvVar9);
          }
        }
        else {
          (*pAVar1->_vptr_Allocator[3])();
        }
      }
    }
    (this->slope_data).data = local_68;
    (this->slope_data).refcount = local_60;
    (this->slope_data).elemsize = local_58;
    (this->slope_data).elempack = local_50;
    (this->slope_data).allocator = local_48;
    (this->slope_data).dims = local_40;
    (this->slope_data).w = iStack_3c;
    (this->slope_data).h = iStack_38;
    (this->slope_data).c = iStack_34;
    (this->slope_data).cstep = local_30;
  }
  if (local_60 != (int *)0x0) {
    LOCK();
    *local_60 = *local_60 + -1;
    UNLOCK();
    if (*local_60 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_68 != (void *)0x0) {
          free(local_68);
        }
      }
      else {
        (*local_48->_vptr_Allocator[3])();
      }
    }
  }
  iVar11 = -100;
  if (((this->slope_data).data != (void *)0x0) &&
     ((long)(this->slope_data).c * (this->slope_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->channels,1);
    if (&this->mean_data != (Mat *)&local_68) {
      if (local_60 != (int *)0x0) {
        LOCK();
        *local_60 = *local_60 + 1;
        UNLOCK();
      }
      piVar7 = (this->mean_data).refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pvVar9 = (this->mean_data).data;
          pAVar1 = (this->mean_data).allocator;
          if (pAVar1 == (Allocator *)0x0) {
            if (pvVar9 != (void *)0x0) {
              free(pvVar9);
            }
          }
          else {
            (*pAVar1->_vptr_Allocator[3])();
          }
        }
      }
      (this->mean_data).data = local_68;
      (this->mean_data).refcount = local_60;
      (this->mean_data).elemsize = local_58;
      (this->mean_data).elempack = local_50;
      (this->mean_data).allocator = local_48;
      (this->mean_data).dims = local_40;
      (this->mean_data).w = iStack_3c;
      (this->mean_data).h = iStack_38;
      (this->mean_data).c = iStack_34;
      (this->mean_data).cstep = local_30;
    }
    if (local_60 != (int *)0x0) {
      LOCK();
      *local_60 = *local_60 + -1;
      UNLOCK();
      if (*local_60 == 0) {
        if (local_48 == (Allocator *)0x0) {
          if (local_68 != (void *)0x0) {
            free(local_68);
          }
        }
        else {
          (*local_48->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->mean_data).data != (void *)0x0) &&
       ((long)(this->mean_data).c * (this->mean_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->channels,1);
      if (&this->var_data != (Mat *)&local_68) {
        if (local_60 != (int *)0x0) {
          LOCK();
          *local_60 = *local_60 + 1;
          UNLOCK();
        }
        piVar7 = (this->var_data).refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pvVar9 = (this->var_data).data;
            pAVar1 = (this->var_data).allocator;
            if (pAVar1 == (Allocator *)0x0) {
              if (pvVar9 != (void *)0x0) {
                free(pvVar9);
              }
            }
            else {
              (*pAVar1->_vptr_Allocator[3])();
            }
          }
        }
        (this->var_data).data = local_68;
        (this->var_data).refcount = local_60;
        (this->var_data).elemsize = local_58;
        (this->var_data).elempack = local_50;
        (this->var_data).allocator = local_48;
        (this->var_data).dims = local_40;
        (this->var_data).w = iStack_3c;
        (this->var_data).h = iStack_38;
        (this->var_data).c = iStack_34;
        (this->var_data).cstep = local_30;
      }
      if (local_60 != (int *)0x0) {
        LOCK();
        *local_60 = *local_60 + -1;
        UNLOCK();
        if (*local_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->var_data).data != (void *)0x0) &&
         ((long)(this->var_data).c * (this->var_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->channels,1);
        if (&this->bias_data != (Mat *)&local_68) {
          if (local_60 != (int *)0x0) {
            LOCK();
            *local_60 = *local_60 + 1;
            UNLOCK();
          }
          piVar7 = (this->bias_data).refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar9 = (this->bias_data).data;
              pAVar1 = (this->bias_data).allocator;
              if (pAVar1 == (Allocator *)0x0) {
                if (pvVar9 != (void *)0x0) {
                  free(pvVar9);
                }
              }
              else {
                (*pAVar1->_vptr_Allocator[3])();
              }
            }
          }
          (this->bias_data).data = local_68;
          (this->bias_data).refcount = local_60;
          (this->bias_data).elemsize = local_58;
          (this->bias_data).elempack = local_50;
          (this->bias_data).allocator = local_48;
          (this->bias_data).dims = local_40;
          (this->bias_data).w = iStack_3c;
          (this->bias_data).h = iStack_38;
          (this->bias_data).c = iStack_34;
          (this->bias_data).cstep = local_30;
        }
        if (local_60 != (int *)0x0) {
          LOCK();
          *local_60 = *local_60 + -1;
          UNLOCK();
          if (*local_60 == 0) {
            if (local_48 == (Allocator *)0x0) {
              if (local_68 != (void *)0x0) {
                free(local_68);
              }
            }
            else {
              (*local_48->_vptr_Allocator[3])();
            }
          }
        }
        if (((this->bias_data).data != (void *)0x0) &&
           ((long)(this->bias_data).c * (this->bias_data).cstep != 0)) {
          iVar6 = this->channels;
          if (((this->a_data).dims == 1) &&
             (((((this->a_data).w == iVar6 && ((this->a_data).elemsize == 4)) &&
               ((this->a_data).elempack == 1)) && ((this->a_data).allocator == (Allocator *)0x0))))
          {
            if ((this->a_data).data == (void *)0x0) {
              return -100;
            }
          }
          else {
            sVar10 = (size_t)iVar6;
            piVar7 = (this->a_data).refcount;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pvVar9 = (this->a_data).data;
                pAVar1 = (this->a_data).allocator;
                if (pAVar1 == (Allocator *)0x0) {
                  if (pvVar9 != (void *)0x0) {
                    free(pvVar9);
                  }
                }
                else {
                  (*pAVar1->_vptr_Allocator[3])();
                }
              }
            }
            (this->a_data).data = (void *)0x0;
            (this->a_data).refcount = (int *)0x0;
            (this->a_data).elemsize = 4;
            (this->a_data).elempack = 1;
            (this->a_data).allocator = (Allocator *)0x0;
            (this->a_data).dims = 1;
            (this->a_data).w = iVar6;
            (this->a_data).h = 1;
            (this->a_data).c = 1;
            (this->a_data).cstep = sVar10;
            if (iVar6 == 0) {
              return -100;
            }
            local_68 = (void *)0x0;
            iVar6 = posix_memalign(&local_68,0x10,sVar10 * 4 + 4);
            pvVar9 = (void *)0x0;
            if (iVar6 == 0) {
              pvVar9 = local_68;
            }
            (this->a_data).data = pvVar9;
            piVar7 = (int *)((long)pvVar9 + sVar10 * 4);
            (this->a_data).refcount = piVar7;
            *piVar7 = 1;
          }
          if ((long)(this->a_data).c * (this->a_data).cstep != 0) {
            iVar6 = this->channels;
            if ((((this->b_data).dims == 1) && ((this->b_data).w == iVar6)) &&
               (((this->b_data).elemsize == 4 &&
                (((this->b_data).elempack == 1 && ((this->b_data).allocator == (Allocator *)0x0)))))
               ) {
              local_68 = (this->b_data).data;
              if (local_68 == (void *)0x0) {
                return -100;
              }
            }
            else {
              sVar10 = (size_t)iVar6;
              piVar7 = (this->b_data).refcount;
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  pvVar9 = (this->b_data).data;
                  pAVar1 = (this->b_data).allocator;
                  if (pAVar1 == (Allocator *)0x0) {
                    if (pvVar9 != (void *)0x0) {
                      free(pvVar9);
                    }
                  }
                  else {
                    (*pAVar1->_vptr_Allocator[3])();
                  }
                }
              }
              (this->b_data).data = (void *)0x0;
              (this->b_data).refcount = (int *)0x0;
              (this->b_data).elemsize = 4;
              (this->b_data).elempack = 1;
              (this->b_data).allocator = (Allocator *)0x0;
              (this->b_data).dims = 1;
              (this->b_data).w = iVar6;
              (this->b_data).h = 1;
              (this->b_data).c = 1;
              (this->b_data).cstep = sVar10;
              if (iVar6 == 0) {
                return -100;
              }
              local_68 = (void *)0x0;
              iVar6 = posix_memalign(&local_68,0x10,sVar10 * 4 + 4);
              pvVar9 = (void *)0x0;
              if (iVar6 == 0) {
                pvVar9 = local_68;
              }
              (this->b_data).data = pvVar9;
              piVar7 = (int *)(sVar10 * 4 + (long)pvVar9);
              (this->b_data).refcount = piVar7;
              *piVar7 = 1;
            }
            if ((long)(this->b_data).c * (this->b_data).cstep != 0) {
              iVar6 = this->channels;
              if ((long)iVar6 < 1) {
                iVar11 = 0;
              }
              else {
                pvVar9 = (this->var_data).data;
                pvVar2 = (this->bias_data).data;
                pvVar3 = (this->slope_data).data;
                pvVar4 = (this->mean_data).data;
                pvVar5 = (this->a_data).data;
                iVar11 = 0;
                lVar8 = 0;
                do {
                  fVar12 = this->eps + *(float *)((long)pvVar9 + lVar8 * 4);
                  auVar14 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar12));
                  fVar13 = auVar14._0_4_;
                  fVar12 = fVar13 * -0.5 * (fVar12 * fVar13 * fVar13 + -3.0);
                  *(float *)((long)pvVar5 + lVar8 * 4) =
                       *(float *)((long)pvVar2 + lVar8 * 4) -
                       *(float *)((long)pvVar4 + lVar8 * 4) * *(float *)((long)pvVar3 + lVar8 * 4) *
                       fVar12;
                  *(float *)((long)local_68 + lVar8 * 4) =
                       fVar12 * *(float *)((long)pvVar3 + lVar8 * 4);
                  lVar8 = lVar8 + 1;
                } while (iVar6 != lVar8);
              }
            }
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int BatchNorm::load_model(const ModelBin& mb)
{
    slope_data = mb.load(channels, 1);
    if (slope_data.empty())
        return -100;

    mean_data = mb.load(channels, 1);
    if (mean_data.empty())
        return -100;

    var_data = mb.load(channels, 1);
    if (var_data.empty())
        return -100;

    bias_data = mb.load(channels, 1);
    if (bias_data.empty())
        return -100;

    a_data.create(channels);
    if (a_data.empty())
        return -100;
    b_data.create(channels);
    if (b_data.empty())
        return -100;

    for (int i=0; i<channels; i++)
    {
        float sqrt_var = sqrt(var_data[i] + eps);
        a_data[i] = bias_data[i] - slope_data[i] * mean_data[i] / sqrt_var;
        b_data[i] = slope_data[i] / sqrt_var;
    }

    return 0;
}